

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.hpp
# Opt level: O0

void __thiscall diy::Master::Proxy::~Proxy(Proxy *this)

{
  bool bVar1;
  _Elt_pointer this_00;
  critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
  *pcVar2;
  int __type;
  int __type_00;
  BlockID *in_RDI;
  pair<const_int,_diy::MemoryBuffer> *x_1;
  iterator __end3;
  iterator __begin3;
  IncomingQueues *__range3;
  pair<const_diy::BlockID,_diy::MemoryBuffer> *x;
  iterator __end2;
  iterator __begin2;
  OutgoingQueues *__range2;
  IncomingQueues *incoming;
  OutgoingQueues *outgoing;
  undefined4 in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  Master *in_stack_ffffffffffffff40;
  undefined1 local_88 [56];
  _Elt_pointer local_38;
  iterator local_30;
  iterator local_28;
  _Elt_pointer local_20;
  _Elt_pointer local_18;
  _Elt_pointer local_10;
  
  this_00 = (_Elt_pointer)Master::outgoing(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_10 = this_00;
  local_18 = (_Elt_pointer)Master::incoming(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c);
  local_20 = (_Elt_pointer)(in_RDI + 9);
  local_28 = Catch::clara::std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::begin((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  local_30 = Catch::clara::std::
             map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
             ::end((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
                    *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  while (bVar1 = Catch::clara::std::operator!=(&stack0xffffffffffffffd8,&stack0xffffffffffffffd0),
        bVar1) {
    local_38 = (_Elt_pointer)
               Catch::clara::std::
               _Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_> *)
                          in_stack_ffffffffffffff40);
    pcVar2 = concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
             ::operator[]((concurrent_map<diy::BlockID,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                           *)this_00,in_RDI);
    critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
              *)&stack0xffffffffffffffb0,(char *)pcVar2,__type);
    resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::operator->((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                  *)&stack0xffffffffffffffb0);
    Catch::clara::std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>::
    emplace_back<diy::MemoryBuffer>
              ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
               in_stack_ffffffffffffff40,
               (MemoryBuffer *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
    ::~resource_accessor
              ((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)0x205cfd);
    if (in_RDI[2] != (BlockID)0x0) {
      IExchangeInfo::inc_work((IExchangeInfo *)0x205d17);
    }
    Catch::clara::std::_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>::
    operator++((_Rb_tree_iterator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_> *)
               in_stack_ffffffffffffff40);
  }
  if (in_RDI[2] == (BlockID)0x0) {
    local_88._48_8_ = in_RDI + 3;
    local_88._40_8_ =
         Catch::clara::std::
         map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
         ::begin((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                  *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_88._32_8_ =
         Catch::clara::std::
         map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
         ::end((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
                *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    while (bVar1 = Catch::clara::std::operator!=
                             ((_Self *)(local_88 + 0x28),(_Self *)(local_88 + 0x20)), bVar1) {
      local_88._24_8_ =
           Catch::clara::std::_Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_>::operator*
                     ((_Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_> *)
                      in_stack_ffffffffffffff40);
      pcVar2 = concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
               ::operator[]((concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
                             *)this_00,&in_RDI->gid);
      critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::access((critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                *)local_88,(char *)pcVar2,__type_00);
      in_stack_ffffffffffffff40 =
           (Master *)
           resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
           ::operator->((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                         *)local_88);
      Catch::clara::std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>
      ::emplace_front<diy::MemoryBuffer>
                ((deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_> *)
                 in_stack_ffffffffffffff40,
                 (MemoryBuffer *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
      resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
      ::~resource_accessor
                ((resource_accessor<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>
                  *)0x205de9);
      Catch::clara::std::_Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_>::operator++
                ((_Rb_tree_iterator<std::pair<const_int,_diy::MemoryBuffer>_> *)
                 in_stack_ffffffffffffff40);
    }
  }
  Catch::clara::std::
  map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
  ::~map((map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
          *)0x205e08);
  Catch::clara::std::
  map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
  ::~map((map<int,_diy::MemoryBuffer,_std::less<int>,_std::allocator<std::pair<const_int,_diy::MemoryBuffer>_>_>
          *)0x205e16);
  return;
}

Assistant:

~Proxy()
    {
        auto& outgoing = master_->outgoing(gid_);
        auto& incoming = master_->incoming(gid_);

        // copy out outgoing_
        for (auto& x : outgoing_)
        {
            outgoing[x.first].access()->emplace_back(std::move(x.second));
            if (iexchange_)
                iexchange_->inc_work();
        }

        // move incoming_ back into master, in case it's a multi-foreach round
        if (!iexchange_)
            for (auto& x : incoming_)
                incoming[x.first].access()->emplace_front(std::move(x.second));
    }